

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

Vec_Int_t * Abc_NtkCollectCoSupps(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  void *__ptr;
  int *piVar4;
  Abc_Ntk_t *pAVar5;
  int iVar6;
  Vec_Ptr_t *__ptr_00;
  Vec_Int_t *vArr;
  Vec_Int_t *pVVar7;
  int *piVar8;
  void *pvVar9;
  Vec_Ptr_t *pVVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  timespec ts;
  timespec local_78;
  Abc_Ntk_t *local_60;
  int local_54;
  long local_50;
  Vec_Int_t *local_48;
  Vec_Ptr_t *local_40;
  long local_38;
  
  local_54 = fVerbose;
  iVar6 = clock_gettime(3,&local_78);
  if (iVar6 < 0) {
    local_50 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_50 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  piVar8 = (int *)0x0;
  __ptr_00 = Abc_NtkDfs(pNtk,0);
  vArr = (Vec_Int_t *)calloc(1,0x10);
  iVar6 = pNtk->vCos->nSize;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar11 = iVar6;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar11;
  if (iVar11 != 0) {
    piVar8 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar7->pArray = piVar8;
  iVar6 = pNtk->vObjs->nSize;
  local_60 = pNtk;
  piVar8 = (int *)malloc(0x10);
  iVar11 = 8;
  if (6 < iVar6 - 1U) {
    iVar11 = iVar6;
  }
  *piVar8 = iVar11;
  if (iVar11 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = calloc((long)iVar11,0x10);
  }
  *(void **)(piVar8 + 2) = pvVar9;
  piVar8[1] = iVar6;
  pVVar10 = local_60->vCis;
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
    do {
      iVar11 = *(int *)((long)pVVar10->pArray[lVar12] + 0x10);
      if (((long)iVar11 < 0) || (iVar6 <= iVar11)) goto LAB_002f064f;
      Vec_IntPush((Vec_Int_t *)((long)iVar11 * 0x10 + (long)pvVar9),(int)lVar12);
      lVar12 = lVar12 + 1;
      pVVar10 = local_60->vCis;
    } while (lVar12 < pVVar10->nSize);
  }
  iVar6 = __ptr_00->nSize;
  local_48 = pVVar7;
  if (0 < iVar6) {
    lVar12 = 0;
    local_40 = __ptr_00;
    do {
      pvVar9 = __ptr_00->pArray[lVar12];
      iVar11 = *(int *)((long)pvVar9 + 0x10);
      if (((long)iVar11 < 0) || (uVar1 = piVar8[1], (int)uVar1 <= iVar11)) goto LAB_002f064f;
      if (0 < *(int *)((long)pvVar9 + 0x1c)) {
        lVar3 = *(long *)(piVar8 + 2);
        pVVar7 = (Vec_Int_t *)((long)iVar11 * 0x10 + lVar3);
        lVar13 = 0;
        local_38 = lVar12;
        do {
          uVar2 = *(uint *)(*(long *)((long)pvVar9 + 0x20) + lVar13 * 4);
          if (((long)(int)uVar2 < 0) || (uVar1 <= uVar2)) goto LAB_002f064f;
          Vec_IntTwoMerge2(pVVar7,(Vec_Int_t *)((long)(int)uVar2 * 0x10 + lVar3),vArr);
          local_78.tv_sec._0_4_ = pVVar7->nCap;
          local_78.tv_sec._4_4_ = pVVar7->nSize;
          local_78.tv_nsec = (long)pVVar7->pArray;
          iVar6 = vArr->nSize;
          piVar4 = vArr->pArray;
          pVVar7->nCap = vArr->nCap;
          pVVar7->nSize = iVar6;
          pVVar7->pArray = piVar4;
          vArr->nCap = (undefined4)local_78.tv_sec;
          vArr->nSize = local_78.tv_sec._4_4_;
          vArr->pArray = (int *)local_78.tv_nsec;
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)((long)pvVar9 + 0x1c));
        iVar6 = local_40->nSize;
        lVar12 = local_38;
        __ptr_00 = local_40;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar6);
  }
  pVVar7 = local_48;
  pAVar5 = local_60;
  pVVar10 = local_60->vCos;
  if (pVVar10->nSize < 1) {
    pvVar9 = *(void **)(piVar8 + 2);
  }
  else {
    lVar12 = 0;
    do {
      iVar6 = **(int **)((long)pVVar10->pArray[lVar12] + 0x20);
      if (((long)iVar6 < 0) || (piVar8[1] <= iVar6)) {
LAB_002f064f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pvVar9 = *(void **)(piVar8 + 2);
      Vec_IntPush(pVVar7,*(int *)((long)pvVar9 + (long)iVar6 * 0x10 + 4));
      lVar12 = lVar12 + 1;
      pVVar10 = pAVar5->vCos;
    } while (lVar12 < pVVar10->nSize);
  }
  iVar6 = *piVar8;
  if ((long)iVar6 < 1) {
    if (pvVar9 == (void *)0x0) goto LAB_002f0581;
  }
  else {
    lVar12 = 0;
    do {
      __ptr = *(void **)((long)pvVar9 + lVar12 + 8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)pvVar9 + lVar12 + 8) = 0;
      }
      lVar12 = lVar12 + 0x10;
    } while ((long)iVar6 * 0x10 != lVar12);
  }
  free(pvVar9);
LAB_002f0581:
  free(piVar8);
  if (__ptr_00->pArray != (void **)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  if (vArr->pArray != (int *)0x0) {
    free(vArr->pArray);
  }
  free(vArr);
  if (local_54 != 0) {
    iVar11 = 3;
    iVar6 = clock_gettime(3,&local_78);
    if (iVar6 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    lVar12 = lVar12 + local_50;
    Abc_Print(iVar11,"%s =","Input  support computation");
    Abc_Print(iVar11,"%9.2f sec\n",SUB84((double)lVar12 / 1000000.0,0));
  }
  return pVVar7;
}

Assistant:

Vec_Int_t * Abc_NtkCollectCoSupps( Abc_Ntk_t * pNtk, int fVerbose )
{
    abctime clk = Abc_Clock();
    Abc_Obj_t * pNode; int i, k;
    Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_Int_t * vFanin, * vFanout, * vTemp = Vec_IntAlloc( 0 );
    Vec_Int_t * vSuppsCo = Vec_IntAlloc( Abc_NtkCoNum(pNtk) );
    Vec_Wec_t * vSupps = Vec_WecStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntPush( Vec_WecEntry(vSupps, Abc_ObjId(pNode)), i );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        vFanout = Vec_WecEntry(vSupps, Abc_ObjId(pNode));
        for ( k = 0; k < Abc_ObjFaninNum(pNode); k++ )
        {
            vFanin = Vec_WecEntry(vSupps, Abc_ObjFaninId(pNode, k));
            Vec_IntTwoMerge2( vFanout, vFanin, vTemp ); 
            ABC_SWAP( Vec_Int_t, *vFanout, *vTemp );
        }
    }
    Abc_NtkForEachCo( pNtk, pNode, i )
        Vec_IntPush( vSuppsCo, Vec_IntSize(Vec_WecEntry(vSupps, Abc_ObjFaninId0(pNode))) );
    Vec_WecFree( vSupps );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTemp );
    if ( fVerbose )
        Abc_PrintTime( 1, "Input  support computation", Abc_Clock() - clk );
    //Vec_IntPrint( vSuppsCo );
    return vSuppsCo;
}